

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

void * mcpl_internal_realloc(void *mem,size_t new_size)

{
  void *pvVar1;
  size_t in_RSI;
  void *in_RDI;
  void *res;
  
  pvVar1 = realloc(in_RDI,in_RSI);
  if (pvVar1 == (void *)0x0) {
    mcpl_error((char *)0x101564);
  }
  return pvVar1;
}

Assistant:

MCPL_LOCAL void * mcpl_internal_realloc( void* mem, size_t new_size)
{
  void * res = realloc( mem, new_size );
  if (!res)
    mcpl_error("memory allocation failed");
  return res;
}